

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O1

void diy::Serialization<std::vector<char,_std::allocator<char>_>_>::load(BinaryBuffer *bb,Vector *v)

{
  size_t s;
  value_type local_21;
  size_type local_20;
  
  (*bb->_vptr_BinaryBuffer[4])(bb,&local_20,8);
  local_21 = '\0';
  Catch::clara::std::vector<char,_std::allocator<char>_>::resize(v,local_20,&local_21);
  if (local_20 != 0) {
    (*bb->_vptr_BinaryBuffer[4])
              (bb,(v->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }